

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pack_unpack.c
# Opt level: O1

json_t * pack(scanner_t *s,va_list *ap)

{
  byte bVar1;
  uint uVar2;
  undefined7 uVar3;
  char cVar4;
  int iVar5;
  double *pdVar6;
  json_t *pjVar7;
  char *pcVar8;
  json_t *pjVar9;
  void *pvVar10;
  int *piVar11;
  longlong *plVar12;
  size_t sVar13;
  long *plVar14;
  char *source;
  longlong value;
  size_t len;
  int local_3c;
  size_t local_38;
  
  bVar1 = (s->token).token;
  if (bVar1 < 0x66) {
    if (bVar1 < 0x5b) {
      if (bVar1 == 0x49) {
        uVar2 = (*ap)[0].gp_offset;
        if ((ulong)uVar2 < 0x29) {
          plVar12 = (longlong *)((ulong)uVar2 + (long)(*ap)[0].reg_save_area);
          (*ap)[0].gp_offset = uVar2 + 8;
        }
        else {
          plVar12 = (longlong *)(*ap)[0].overflow_arg_area;
          (*ap)[0].overflow_arg_area = plVar12 + 1;
        }
        value = *plVar12;
        goto LAB_001080a6;
      }
      if (bVar1 == 0x4f) {
        next_token(s);
        cVar4 = (s->token).token;
        if (cVar4 != '?') {
          uVar3 = *(undefined7 *)&(s->token).field_0x11;
          (s->next_token).token = (s->token).token;
          *(undefined7 *)&(s->next_token).field_0x11 = uVar3;
          iVar5 = (s->token).column;
          sVar13 = (s->token).pos;
          (s->next_token).line = (s->token).line;
          (s->next_token).column = iVar5;
          (s->next_token).pos = sVar13;
          iVar5 = (s->prev_token).column;
          sVar13 = (s->prev_token).pos;
          (s->token).line = (s->prev_token).line;
          (s->token).column = iVar5;
          (s->token).pos = sVar13;
          uVar3 = *(undefined7 *)&(s->prev_token).field_0x11;
          (s->token).token = (s->prev_token).token;
          *(undefined7 *)&(s->token).field_0x11 = uVar3;
        }
        uVar2 = (*ap)[0].gp_offset;
        if ((ulong)uVar2 < 0x29) {
          plVar14 = (long *)((ulong)uVar2 + (long)(*ap)[0].reg_save_area);
          (*ap)[0].gp_offset = uVar2 + 8;
        }
        else {
          plVar14 = (long *)(*ap)[0].overflow_arg_area;
          (*ap)[0].overflow_arg_area = plVar14 + 1;
        }
        pjVar7 = (json_t *)*plVar14;
        if ((cVar4 != '?') || (pjVar7 != (json_t *)0x0)) {
          if (pjVar7 == (json_t *)0x0) {
            return (json_t *)0x0;
          }
          if (pjVar7->refcount != 0xffffffffffffffff) {
            pjVar7->refcount = pjVar7->refcount + 1;
            return pjVar7;
          }
          return pjVar7;
        }
        goto switchD_00107c18_caseD_6e;
      }
    }
    else {
      if (bVar1 == 0x5b) {
        pjVar7 = json_array();
        next_token(s);
        do {
          cVar4 = (s->token).token;
          if (cVar4 == ']') {
            return pjVar7;
          }
          if (cVar4 == '\0') goto LAB_001080f9;
          pjVar9 = pack(s,ap);
          if (pjVar9 == (json_t *)0x0) {
            pvVar10 = memchr("soO",(int)(s->token).token,4);
            if ((pvVar10 == (void *)0x0) || ((s->next_token).token != '*')) goto LAB_00108111;
LAB_00107f41:
            next_token(s);
          }
          else {
            iVar5 = json_array_append_new(pjVar7,pjVar9);
            if (iVar5 != 0) {
              source = "<internal>";
              pcVar8 = "Unable to append to array";
              goto LAB_00108107;
            }
            pvVar10 = memchr("soO",(int)(s->token).token,4);
            if ((pvVar10 != (void *)0x0) && ((s->next_token).token == '*')) goto LAB_00107f41;
          }
          next_token(s);
        } while( true );
      }
      if (bVar1 == 0x62) {
        uVar2 = (*ap)[0].gp_offset;
        if ((ulong)uVar2 < 0x29) {
          piVar11 = (int *)((ulong)uVar2 + (long)(*ap)[0].reg_save_area);
          (*ap)[0].gp_offset = uVar2 + 8;
        }
        else {
          piVar11 = (int *)(*ap)[0].overflow_arg_area;
          (*ap)[0].overflow_arg_area = piVar11 + 2;
        }
        if (*piVar11 == 0) {
          pjVar7 = json_false();
          return pjVar7;
        }
        pjVar7 = json_true();
        return pjVar7;
      }
    }
  }
  else {
    switch(bVar1) {
    case 0x66:
      uVar2 = (*ap)[0].fp_offset;
      if ((ulong)uVar2 < 0xa1) {
        pdVar6 = (double *)((ulong)uVar2 + (long)(*ap)[0].reg_save_area);
        (*ap)[0].fp_offset = uVar2 + 0x10;
      }
      else {
        pdVar6 = (double *)(*ap)[0].overflow_arg_area;
        (*ap)[0].overflow_arg_area = pdVar6 + 1;
      }
      pjVar7 = json_real(*pdVar6);
      return pjVar7;
    case 0x67:
    case 0x68:
    case 0x6a:
    case 0x6b:
    case 0x6c:
    case 0x6d:
      break;
    case 0x69:
      uVar2 = (*ap)[0].gp_offset;
      if ((ulong)uVar2 < 0x29) {
        piVar11 = (int *)((ulong)uVar2 + (long)(*ap)[0].reg_save_area);
        (*ap)[0].gp_offset = uVar2 + 8;
      }
      else {
        piVar11 = (int *)(*ap)[0].overflow_arg_area;
        (*ap)[0].overflow_arg_area = piVar11 + 2;
      }
      value = (longlong)*piVar11;
LAB_001080a6:
      pjVar7 = json_integer(value);
      return pjVar7;
    case 0x6f:
      next_token(s);
      cVar4 = (s->token).token;
      if (cVar4 != '?') {
        uVar3 = *(undefined7 *)&(s->token).field_0x11;
        (s->next_token).token = (s->token).token;
        *(undefined7 *)&(s->next_token).field_0x11 = uVar3;
        iVar5 = (s->token).column;
        sVar13 = (s->token).pos;
        (s->next_token).line = (s->token).line;
        (s->next_token).column = iVar5;
        (s->next_token).pos = sVar13;
        iVar5 = (s->prev_token).column;
        sVar13 = (s->prev_token).pos;
        (s->token).line = (s->prev_token).line;
        (s->token).column = iVar5;
        (s->token).pos = sVar13;
        uVar3 = *(undefined7 *)&(s->prev_token).field_0x11;
        (s->token).token = (s->prev_token).token;
        *(undefined7 *)&(s->token).field_0x11 = uVar3;
      }
      uVar2 = (*ap)[0].gp_offset;
      if ((ulong)uVar2 < 0x29) {
        plVar14 = (long *)((ulong)uVar2 + (long)(*ap)[0].reg_save_area);
        (*ap)[0].gp_offset = uVar2 + 8;
      }
      else {
        plVar14 = (long *)(*ap)[0].overflow_arg_area;
        (*ap)[0].overflow_arg_area = plVar14 + 1;
      }
      pjVar7 = (json_t *)*plVar14;
      if (cVar4 != '?') {
        return pjVar7;
      }
      if (pjVar7 != (json_t *)0x0) {
        return pjVar7;
      }
    case 0x6e:
switchD_00107c18_caseD_6e:
      pjVar7 = json_null();
      return pjVar7;
    default:
      if (bVar1 == 0x73) {
        next_token(s);
        cVar4 = (s->token).token;
        if (cVar4 != '?') {
          uVar3 = *(undefined7 *)&(s->token).field_0x11;
          (s->next_token).token = (s->token).token;
          *(undefined7 *)&(s->next_token).field_0x11 = uVar3;
          iVar5 = (s->token).column;
          sVar13 = (s->token).pos;
          (s->next_token).line = (s->token).line;
          (s->next_token).column = iVar5;
          (s->next_token).pos = sVar13;
          iVar5 = (s->prev_token).column;
          sVar13 = (s->prev_token).pos;
          (s->token).line = (s->prev_token).line;
          (s->token).column = iVar5;
          (s->token).pos = sVar13;
          uVar3 = *(undefined7 *)&(s->prev_token).field_0x11;
          (s->token).token = (s->prev_token).token;
          *(undefined7 *)&(s->token).field_0x11 = uVar3;
        }
        pcVar8 = read_string(s,ap,"string",&local_38,&local_3c);
        if (pcVar8 == (char *)0x0) {
          if (cVar4 != '?') {
            return (json_t *)0x0;
          }
          pjVar7 = json_null();
          return pjVar7;
        }
        if (local_3c == 0) {
          pjVar7 = json_stringn_nocheck(pcVar8,local_38);
          return pjVar7;
        }
        pjVar7 = jsonp_stringn_nocheck_own(pcVar8,local_38);
        return pjVar7;
      }
      if (bVar1 == 0x7b) {
        pjVar7 = json_object();
        next_token(s);
        cVar4 = (s->token).token;
        if (cVar4 == '}') {
          return pjVar7;
        }
        do {
          if (cVar4 != 's') {
            if (cVar4 == '\0') {
LAB_001080f9:
              source = "<format>";
              pcVar8 = "Unexpected end of format string";
LAB_00108107:
              set_error(s,source,pcVar8);
            }
            else {
              set_error(s,"<format>","Expected format \'s\', got \'%c\'",(ulong)(uint)(int)cVar4);
            }
LAB_00108111:
            if (((pjVar7 != (json_t *)0x0) && (pjVar7->refcount != 0xffffffffffffffff)) &&
               (sVar13 = pjVar7->refcount - 1, pjVar7->refcount = sVar13, sVar13 == 0)) {
              json_delete(pjVar7);
            }
            return (json_t *)0x0;
          }
          pcVar8 = read_string(s,ap,"object key",&local_38,&local_3c);
          if (pcVar8 == (char *)0x0) goto LAB_00108111;
          next_token(s);
          pjVar9 = pack(s,ap);
          if (pjVar9 == (json_t *)0x0) {
            if (local_3c != 0) {
              jsonp_free(pcVar8);
            }
            pvVar10 = memchr("soO",(int)(s->token).token,4);
            if ((pvVar10 == (void *)0x0) || ((s->next_token).token != '*')) goto LAB_00108111;
LAB_00107daa:
            next_token(s);
          }
          else {
            iVar5 = json_object_set_new_nocheck(pjVar7,pcVar8,pjVar9);
            if (iVar5 != 0) {
              set_error(s,"<internal>","Unable to add key \"%s\"",pcVar8);
              if (local_3c != 0) {
                jsonp_free(pcVar8);
              }
              goto LAB_00108111;
            }
            if (local_3c != 0) {
              jsonp_free(pcVar8);
            }
            pvVar10 = memchr("soO",(int)(s->token).token,4);
            if ((pvVar10 != (void *)0x0) && ((s->next_token).token == '*')) goto LAB_00107daa;
          }
          next_token(s);
          cVar4 = (s->token).token;
          if (cVar4 == '}') {
            return pjVar7;
          }
        } while( true );
      }
    }
  }
  set_error(s,"<format>","Unexpected format character \'%c\'",(ulong)(uint)(int)(char)bVar1);
  return (json_t *)0x0;
}

Assistant:

static json_t *pack(scanner_t *s, va_list *ap)
{
    switch(token(s)) {
        case '{':
            return pack_object(s, ap);

        case '[':
            return pack_array(s, ap);

        case 's': /* string */
            return pack_string(s, ap);

        case 'n': /* null */
            return json_null();

        case 'b': /* boolean */
            return va_arg(*ap, int) ? json_true() : json_false();

        case 'i': /* integer from int */
            return json_integer(va_arg(*ap, int));

        case 'I': /* integer from json_int_t */
            return json_integer(va_arg(*ap, json_int_t));

        case 'f': /* real */
            return json_real(va_arg(*ap, double));

        case 'O': /* a json_t object; increments refcount */
        {
            int nullable;
            json_t *json;

            next_token(s);
            nullable = token(s) == '?';
            if (!nullable)
                prev_token(s);

            json = va_arg(*ap, json_t *);
            if (!json && nullable) {
                return json_null();
            } else {
                return json_incref(json);
            }
        }

        case 'o': /* a json_t object; doesn't increment refcount */
        {
            int nullable;
            json_t *json;

            next_token(s);
            nullable = token(s) == '?';
            if (!nullable)
                prev_token(s);

            json = va_arg(*ap, json_t *);
            if (!json && nullable) {
                return json_null();
            } else {
                return json;
            }
        }

        default:
            set_error(s, "<format>", "Unexpected format character '%c'",
                      token(s));
            return NULL;
    }
}